

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool __thiscall
picojson::
input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::expect(input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,int expected)

{
  int iVar1;
  undefined4 in_register_00000034;
  
  iVar1 = expected;
  skip_ws(this);
  iVar1 = getc(this,(FILE *)CONCAT44(in_register_00000034,iVar1));
  if (iVar1 != expected) {
    this->consumed_ = false;
  }
  return iVar1 == expected;
}

Assistant:

bool expect(const int expected) {
    skip_ws();
    if (getc() != expected) {
      ungetc();
      return false;
    }
    return true;
  }